

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_gen_keypair_base
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *G,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t count;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar5;
  ulong uVar6;
  ulong size;
  
  pmVar1 = (grp->G).X.p;
  if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
    return -0x4f80;
  }
  uVar6 = grp->nbits + 7;
  size = uVar6 >> 3;
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    iVar5 = 6;
    do {
      iVar2 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
      iVar3 = extraout_EDX;
      if (iVar2 != 0) goto LAB_0011d81a;
      sVar4 = mbedtls_mpi_bitlen(d);
    } while (sVar4 == 0);
    sVar4 = mbedtls_mpi_bitlen(d);
    uVar6 = grp->nbits;
    count = (sVar4 - 1) - uVar6;
    if (sVar4 - 1 < uVar6 || count == 0) {
      iVar2 = mbedtls_mpi_set_bit(d,uVar6,'\x01');
      iVar3 = extraout_EDX_01;
    }
    else {
      iVar2 = mbedtls_mpi_shift_r(d,count);
      iVar3 = extraout_EDX_00;
    }
    if ((((iVar2 == 0) &&
         (iVar2 = mbedtls_mpi_set_bit(d,0,'\0'), iVar3 = extraout_EDX_02, iVar2 == 0)) &&
        (iVar2 = mbedtls_mpi_set_bit(d,1,'\0'), iVar3 = extraout_EDX_03, iVar2 == 0)) &&
       ((grp->nbits != 0xfe ||
        (iVar2 = mbedtls_mpi_set_bit(d,2,'\0'), iVar3 = extraout_EDX_04, iVar2 == 0)))) {
      iVar2 = 0;
      iVar5 = 0;
    }
LAB_0011d81a:
    if ((iVar5 != 0) && (iVar5 != 6)) {
      return iVar3;
    }
  }
  else {
    if (pmVar1 == (mbedtls_mpi_uint *)0x0) {
      return -0x4f80;
    }
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      return -0x4f80;
    }
    iVar2 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
    iVar5 = 6;
    if (iVar2 == 0) {
      iVar5 = 0x1f;
      do {
        iVar2 = mbedtls_mpi_shift_r(d,(uVar6 & 0xfffffffffffffff8) - grp->nbits);
        if (iVar2 != 0) break;
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          iVar5 = 1;
LAB_0011d845:
          iVar2 = 0;
          goto LAB_0011d84f;
        }
        iVar3 = mbedtls_mpi_cmp_int(d,1);
        if ((-1 < iVar3) && (iVar3 = mbedtls_mpi_cmp_mpi(d,&grp->N), iVar3 < 0)) {
          iVar5 = 0;
          goto LAB_0011d845;
        }
        iVar2 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
      } while (iVar2 == 0);
      iVar5 = 6;
    }
LAB_0011d84f:
    if ((iVar5 != 6) && (iVar5 != 0)) {
      return -0x4d00;
    }
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar5 = mbedtls_ecp_mul(grp,Q,d,G,f_rng,p_rng);
  return iVar5;
}

Assistant:

int mbedtls_ecp_gen_keypair_base( mbedtls_ecp_group *grp,
                     const mbedtls_ecp_point *G,
                     mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    size_t n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
        } while( mbedtls_mpi_bitlen( d ) == 0);

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last two bits are unset for Curve448, three bits for
           Curve25519 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        if( grp->nbits == 254 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
        }
    }
    else
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 );
    }
    else
#endif /* ECP_SHORTWEIERSTRASS */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

cleanup:
    if( ret != 0 )
        return( ret );

    return( mbedtls_ecp_mul( grp, Q, d, G, f_rng, p_rng ) );
}